

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLString.cpp
# Opt level: O0

XMLCh * xercesc_4_0::XMLString::makeUName(XMLCh *pszURI,XMLCh *pszName)

{
  undefined1 auVar1 [16];
  XMLSize_t XVar2;
  XMLSize_t XVar3;
  ulong uVar4;
  XMLCh local_2c [2];
  XMLSize_t XStack_28;
  XMLCh szTmp [2];
  XMLSize_t uriLen;
  XMLCh *pszRet;
  XMLCh *pszName_local;
  XMLCh *pszURI_local;
  
  XVar2 = stringLen(pszURI);
  XStack_28 = XVar2;
  if (XVar2 == 0) {
    uriLen = (XMLSize_t)replicate(pszName,XMLPlatformUtils::fgMemoryManager);
  }
  else {
    XVar3 = stringLen(pszName);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = XVar2 + XVar3 + 3;
    uVar4 = SUB168(auVar1 * ZEXT816(2),0);
    if (SUB168(auVar1 * ZEXT816(2),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    uriLen = (XMLSize_t)operator_new__(uVar4);
    local_2c[1] = 0;
    local_2c[0] = L'{';
    copyString((XMLCh *)uriLen,local_2c);
    catString((XMLCh *)uriLen,pszURI);
    local_2c[0] = L'}';
    catString((XMLCh *)uriLen,local_2c);
    catString((XMLCh *)uriLen,pszName);
  }
  return (XMLCh *)uriLen;
}

Assistant:

XMLCh*
XMLString::makeUName(const XMLCh* const pszURI, const XMLCh* const pszName)
{
    //
    //  If there is a URI, then format out the full name in the {uri}name
    //  form. Otherwise, just set it to the same thing as the base name.
    //
    XMLCh* pszRet = 0;
    const XMLSize_t uriLen = stringLen(pszURI);
    if (uriLen)
    {
        pszRet = new XMLCh[uriLen + stringLen(pszName) + 3];

        XMLCh szTmp[2];
        szTmp[1] = 0;

        szTmp[0] = chOpenCurly;
        copyString(pszRet, szTmp);
        catString(pszRet, pszURI);
        szTmp[0] = chCloseCurly;
        catString(pszRet, szTmp);
        catString(pszRet, pszName);
    }
     else
    {
        pszRet = replicate(pszName);
    }
    return pszRet;
}